

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

int __thiscall libtorrent::aux::torrent::priority(torrent *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  peer_class *ppVar3;
  int iVar4;
  long lVar5;
  
  if ('\0' < (this->super_peer_class_set).m_size) {
    lVar5 = 0;
    iVar4 = 0;
    do {
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x32])();
      ppVar3 = peer_class_pool::at((peer_class_pool *)CONCAT44(extraout_var,iVar2),
                                   (peer_class_t)
                                   (this->super_peer_class_set).m_class.
                                   super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
                                   ._M_elems[lVar5].m_val);
      iVar2 = (ppVar3->priority)._M_elems[0];
      if (iVar2 < iVar4) {
        iVar2 = iVar4;
      }
      iVar1 = (ppVar3->priority)._M_elems[1];
      iVar4 = iVar2;
      if (iVar2 <= iVar1) {
        iVar4 = iVar1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->super_peer_class_set).m_size);
    return iVar4;
  }
  return 0;
}

Assistant:

int torrent::priority() const
	{
		int priority = 0;
		for (int i = 0; i < num_classes(); ++i)
		{
			span<int const> prio = m_ses.peer_classes().at(class_at(i))->priority;
			priority = std::max(priority, prio[peer_connection::upload_channel]);
			priority = std::max(priority, prio[peer_connection::download_channel]);
		}
		return priority;
	}